

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O1

void garray_cosinesum(_garray *x,t_symbol *s,int argc,t_atom *argv)

{
  t_float *vsin;
  uint argc_00;
  ulong uVar1;
  t_float tVar2;
  t_float dcval;
  
  if (argc < 2) {
    pd_error((void *)0x0,"sinesum: %s: need number of points and partial strengths",
             x->x_realname->s_name);
    return;
  }
  tVar2 = atom_getfloatarg(0,argc,argv);
  argc_00 = argc - 1;
  vsin = (t_float *)getbytes((ulong)argc_00 * 4);
  if (vsin != (t_float *)0x0) {
    uVar1 = 0;
    do {
      dcval = atom_getfloatarg((int)uVar1,argc_00,argv + 1);
      vsin[uVar1] = dcval;
      uVar1 = uVar1 + 1;
    } while (argc_00 != uVar1);
    garray_dofo(x,(long)tVar2,dcval,argc_00,vsin,0);
    freebytes(vsin,(ulong)argc_00 * 4);
    return;
  }
  return;
}

Assistant:

static void garray_cosinesum(t_garray *x, t_symbol *s, int argc, t_atom *argv)
{
    t_float *svec;
    long npoints;
    int i;
    if (argc < 2)
    {
        pd_error(0, "sinesum: %s: need number of points and partial strengths",
            x->x_realname->s_name);
        return;
    }

    npoints = atom_getfloatarg(0, argc, argv);
    argv++, argc--;

    svec = (t_float *)t_getbytes(sizeof(t_float) * argc);
    if (!svec) return;

    for (i = 0; i < argc; i++)
        svec[i] = atom_getfloatarg(i, argc, argv);
    garray_dofo(x, npoints, 0, argc, svec, 0);
    t_freebytes(svec, sizeof(t_float) * argc);
}